

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  int *piVar1;
  uchar filterType;
  byte bVar2;
  uchar *out_00;
  undefined4 uVar3;
  size_t sVar4;
  uint uVar5;
  ulong bytewidth;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  LodePNGFilterStrategy LVar9;
  ulong uVar10;
  ulong uVar11;
  ulong length;
  uchar *puVar12;
  ucvector *puVar13;
  uchar *puVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  size_t *psVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float result;
  float fVar27;
  uchar *local_558;
  uchar *local_550;
  ulong local_538;
  long local_530;
  uchar *local_518;
  uchar *dummy;
  long local_508;
  ulong local_500;
  ulong local_4f8;
  uchar *local_4f0;
  ucvector attempt_1 [5];
  size_t size [5];
  ulong uStack_440;
  ucvector attempt [5];
  
  uVar10 = (ulong)h;
  uVar5 = lodepng_get_bpp(info);
  LVar9 = settings->filter_strategy;
  if ((settings->filter_palette_zero != 0) &&
     ((info->colortype == LCT_PALETTE || (info->bitdepth < 8)))) {
    LVar9 = LFS_ZERO;
  }
  if (uVar5 != 0) {
    if (LFS_PREDEFINED < LVar9) {
      return 0x58;
    }
    length = (ulong)(w * uVar5 + 7 >> 3);
    bytewidth = (ulong)(uVar5 + 7 >> 3);
    switch(LVar9) {
    case LFS_ZERO:
      uVar10 = (ulong)h;
      local_558 = out + 1;
      puVar14 = (uchar *)0x0;
      while (puVar12 = in, bVar22 = uVar10 != 0, uVar10 = uVar10 - 1, bVar22) {
        local_558[-1] = '\0';
        filterScanline(local_558,puVar12,puVar14,length,bytewidth,'\0');
        local_558 = local_558 + length + 1;
        in = puVar12 + length;
        puVar14 = puVar12;
      }
      return 0;
    case LFS_MINSUM:
      lVar19 = 0;
      do {
        if (lVar19 + 0x18 == 0x90) {
          puVar14 = out + 1;
          uVar21 = 0;
          uVar18 = 0;
          local_550 = (uchar *)0x0;
          for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
            lVar19 = uVar17 * length;
            for (uVar7 = 0; uVar7 != 5; uVar7 = uVar7 + 1) {
              puVar12 = attempt[uVar7].data;
              filterScanline(puVar12,in + lVar19,local_550,length,bytewidth,(uchar)uVar7);
              uVar8 = 0;
              uVar11 = 0;
              if (uVar7 == 0) {
                for (; length != uVar11; uVar11 = uVar11 + 1) {
                  uVar8 = uVar8 + puVar12[uVar11];
                }
              }
              else {
                for (; length != uVar11; uVar11 = uVar11 + 1) {
                  bVar2 = puVar12[uVar11];
                  uVar5 = bVar2 ^ 0xff;
                  if (-1 < (char)bVar2) {
                    uVar5 = (uint)bVar2;
                  }
                  uVar8 = uVar8 + uVar5;
                }
              }
              bVar22 = uVar8 < uVar21;
              if (bVar22 || uVar7 == 0) {
                uVar21 = uVar8;
              }
              if (bVar22 || uVar7 == 0) {
                uVar18 = uVar7 & 0xff;
              }
            }
            out[(length + 1) * uVar17] = (uchar)uVar18;
            for (uVar7 = 0; length != uVar7; uVar7 = uVar7 + 1) {
              puVar14[uVar7] = attempt[uVar18].data[uVar7];
            }
            puVar14 = puVar14 + length + 1;
            local_550 = in + lVar19;
          }
          for (lVar19 = 0; lVar19 != 0x78; lVar19 = lVar19 + 0x18) {
            ucvector_cleanup((void *)((long)&attempt[0].data + lVar19));
          }
          return 0;
        }
        puVar13 = (ucvector *)((long)&attempt[0].data + lVar19);
        puVar13->data = (uchar *)0x0;
        *(undefined8 *)((long)&attempt[0].size + lVar19) = 0;
        *(undefined8 *)((long)&attempt[0].allocsize + lVar19) = 0;
        uVar5 = ucvector_resize(puVar13,length);
        lVar19 = lVar19 + 0x18;
      } while (uVar5 != 0);
      break;
    case LFS_ENTROPY:
      lVar19 = 0;
      do {
        if (lVar19 + 0x18 == 0x90) {
          lVar19 = length + 1;
          puVar14 = out + 1;
          fVar23 = 0.0;
          uVar21 = 0;
          puVar12 = (uchar *)0x0;
          for (uVar18 = 0; uVar18 != uVar10; uVar18 = uVar18 + 1) {
            lVar15 = uVar18 * length;
            for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
              out_00 = attempt_1[uVar17].data;
              filterScanline(out_00,in + lVar15,puVar12,length,bytewidth,(uchar)uVar17);
              for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
                *(undefined4 *)((long)&attempt[0].data + lVar6 * 4) = 0;
              }
              for (uVar7 = 0; length != uVar7; uVar7 = uVar7 + 1) {
                piVar1 = (int *)((long)&attempt[0].data + (ulong)out_00[uVar7] * 4);
                *piVar1 = *piVar1 + 1;
              }
              piVar1 = (int *)((long)&attempt[0].data + uVar17 * 4);
              *piVar1 = *piVar1 + 1;
              fVar24 = 0.0;
              for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
                uVar5 = *(uint *)((long)&attempt[0].data + lVar6 * 4);
                if (uVar5 == 0) {
                  fVar25 = 0.0;
                }
                else {
                  fVar25 = (float)uVar5 / (float)(int)lVar19;
                  fVar27 = 0.0;
                  for (fVar26 = 1.0 / fVar25; 32.0 < fVar26; fVar26 = fVar26 * 0.0625) {
                    fVar27 = fVar27 + 4.0;
                  }
                  for (; 2.0 < fVar26; fVar26 = fVar26 * 0.5) {
                    fVar27 = fVar27 + 1.0;
                  }
                  fVar25 = fVar25 * ((fVar26 * fVar26 * 3.0 * -0.5 +
                                      (fVar26 * fVar26 * fVar26) / 3.0 + fVar26 * 3.0 + -1.83333) *
                                     1.442695 + fVar27);
                }
                fVar24 = fVar24 + fVar25;
              }
              if (fVar24 < fVar23 || uVar17 == 0) {
                uVar21 = uVar17 & 0xffffffff;
                fVar23 = fVar24;
              }
            }
            out[lVar19 * uVar18] = (uchar)uVar21;
            for (uVar17 = 0; length != uVar17; uVar17 = uVar17 + 1) {
              puVar14[uVar17] = attempt_1[uVar21].data[uVar17];
            }
            puVar14 = puVar14 + lVar19;
            puVar12 = in + lVar15;
          }
          for (lVar19 = 0; lVar19 != 0x78; lVar19 = lVar19 + 0x18) {
            ucvector_cleanup((void *)((long)&attempt_1[0].data + lVar19));
          }
          return 0;
        }
        puVar13 = (ucvector *)((long)&attempt_1[0].data + lVar19);
        puVar13->data = (uchar *)0x0;
        *(undefined8 *)((long)&attempt_1[0].size + lVar19) = 0;
        *(undefined8 *)((long)&attempt_1[0].allocsize + lVar19) = 0;
        uVar5 = ucvector_resize(puVar13,length);
        lVar19 = lVar19 + 0x18;
      } while (uVar5 != 0);
      break;
    case LFS_BRUTE_FORCE:
      uVar3 = (settings->zlibsettings).use_lz77;
      attempt_1[0].size._0_4_ = (settings->zlibsettings).windowsize;
      attempt_1[0].size._4_4_ = (settings->zlibsettings).minmatch;
      attempt_1[1].allocsize = (size_t)(settings->zlibsettings).custom_context;
      attempt_1[0].allocsize._0_4_ = (settings->zlibsettings).nicematch;
      attempt_1[0].allocsize._4_4_ = (settings->zlibsettings).lazymatching;
      attempt_1[0].data = (uchar *)CONCAT44(uVar3,1);
      attempt_1[1].data = (uchar *)0x0;
      attempt_1[1].size = 0;
      for (lVar19 = 0; lVar19 != 0x78; lVar19 = lVar19 + 0x18) {
        puVar13 = (ucvector *)((long)&attempt[0].data + lVar19);
        puVar13->data = (uchar *)0x0;
        *(undefined8 *)((long)&attempt[0].size + lVar19) = 0;
        *(undefined8 *)((long)&attempt[0].allocsize + lVar19) = 0;
        ucvector_resize(puVar13,length);
      }
      local_508 = length + 1;
      puVar14 = out + 1;
      local_518 = (uchar *)0x0;
      local_538 = 0;
      uVar5 = 0;
      uVar18 = 0;
      local_500 = uVar10;
      while (uVar18 != local_500) {
        lVar15 = uVar18 * length;
        local_530 = 0;
        psVar20 = &attempt[0].size;
        local_4f8 = uVar18;
        local_4f0 = puVar14;
        for (lVar19 = -5; lVar19 != 0; lVar19 = lVar19 + 1) {
          sVar4 = *psVar20;
          puVar14 = ((ucvector *)(psVar20 + -1))->data;
          uVar16 = (int)lVar19 + 5;
          filterScanline(puVar14,in + lVar15,local_518,length,bytewidth,(uchar)uVar16);
          (&uStack_440)[lVar19] = 0;
          dummy = (uchar *)0x0;
          zlib_compress(&dummy,(size_t *)((long)size + local_530),puVar14,(ulong)(uint)sVar4,
                        (LodePNGCompressSettings *)attempt_1);
          free(dummy);
          if ((&uStack_440)[lVar19] < local_538 || lVar19 == -5) {
            uVar5 = uVar16;
            local_538 = (&uStack_440)[lVar19];
          }
          psVar20 = psVar20 + 3;
          local_530 = local_530 + 8;
        }
        out[local_508 * local_4f8] = (uchar)uVar5;
        for (uVar10 = 0; length != uVar10; uVar10 = uVar10 + 1) {
          local_4f0[uVar10] = attempt[uVar5].data[uVar10];
        }
        puVar14 = local_4f0 + local_508;
        local_518 = in + lVar15;
        uVar18 = local_4f8 + 1;
      }
      for (lVar19 = 0; lVar19 != 0x78; lVar19 = lVar19 + 0x18) {
        ucvector_cleanup((void *)((long)&attempt[0].data + lVar19));
      }
      return 0;
    case LFS_PREDEFINED:
      local_558 = out + 1;
      puVar14 = (uchar *)0x0;
      for (uVar18 = 0; puVar12 = in, uVar10 != uVar18; uVar18 = uVar18 + 1) {
        filterType = settings->predefined_filters[uVar18];
        local_558[-1] = filterType;
        filterScanline(local_558,puVar12,puVar14,length,bytewidth,filterType);
        local_558 = local_558 + length + 1;
        in = puVar12 + length;
        puVar14 = puVar12;
      }
      return 0;
    }
    return 0x53;
  }
  return 0x1f;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y < h; y++)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y < h; y++)
      {
        /*try the 5 filter types*/
        for(type = 0; type < 5; type++)
        {
          filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x < linebytes; x++) sum[type] += (unsigned char)(attempt[type].data[x]);
          }
          else
          {
            for(x = 0; x < linebytes; x++)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type].data[x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
      }
    }

    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    for(y = 0; y < h; y++)
    {
      /*try the 5 filter types*/
      for(type = 0; type < 5; type++)
      {
        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x < 256; x++) count[x] = 0;
        for(x = 0; x < linebytes; x++) count[attempt[type].data[x]]++;
        count[type]++; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x < 256; x++)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }

    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y < h; y++)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      ucvector_resize(&attempt[type], linebytes); /*todo: give error if resize failed*/
    }
    for(y = 0; y < h; y++) /*try the 5 filter types*/
    {
      for(type = 0; type < 5; type++)
      {
        unsigned testsize = attempt[type].size;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type].data, testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }
    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}